

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O3

void __thiscall
Assimp::SpatialSort::FindIdenticalPositions
          (SpatialSort *this,aiVector3D *pPosition,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults)

{
  pointer *ppuVar1;
  ai_real aVar2;
  iterator __position;
  float fVar3;
  BinFloat binValue;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ai_real aVar10;
  ulong uVar11;
  pointer pEVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar13 = pPosition->z * (this->mPlaneNormal).z +
           pPosition->x * (this->mPlaneNormal).x + pPosition->y * (this->mPlaneNormal).y;
  fVar3 = (float)(-0x80000000 - (int)fVar13);
  if (-1 < (int)fVar13) {
    fVar3 = fVar13;
  }
  iVar7 = (int)fVar3 + -5;
  uVar6 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(poResults,0);
  pEVar12 = (this->mPositions).
            super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar12 >> 2) *
          -0x3333333333333333;
  uVar8 = uVar4 >> 1 & 0x7fffffff;
  if ((uint)uVar4 < 8) {
    uVar5 = (uint)uVar8;
  }
  else {
    uVar11 = uVar4 >> 2 & 0x3fffffff;
    do {
      aVar2 = pEVar12[uVar8].mDistance;
      aVar10 = (ai_real)(-0x80000000 - (int)aVar2);
      if (-1 < (int)aVar2) {
        aVar10 = aVar2;
      }
      uVar9 = (uint)uVar11;
      uVar5 = uVar9;
      if (iVar7 <= (int)aVar10) {
        uVar5 = -uVar9;
      }
      uVar5 = uVar5 + (int)uVar8;
      uVar11 = uVar11 >> 1;
      uVar8 = (ulong)uVar5;
    } while (3 < uVar9);
  }
  do {
    if (uVar5 == 0) {
LAB_003bded8:
      if (uVar6 < uVar4 - 1) {
        uVar5 = (uint)uVar6;
        do {
          uVar5 = uVar5 + 1;
          aVar2 = pEVar12[uVar6].mDistance;
          aVar10 = (ai_real)(-0x80000000 - (int)aVar2);
          if (-1 < (int)aVar2) {
            aVar10 = aVar2;
          }
        } while (((int)aVar10 < iVar7) && (uVar6 = (ulong)uVar5, uVar6 < uVar4 - 1));
      }
      pEVar12 = pEVar12 + uVar6;
      while( true ) {
        aVar2 = pEVar12->mDistance;
        aVar10 = (ai_real)(-0x80000000 - (int)aVar2);
        if (-1 < (int)aVar2) {
          aVar10 = aVar2;
        }
        if ((int)fVar3 + 5 <= (int)aVar10) break;
        fVar13 = (pEVar12->mPosition).x - pPosition->x;
        fVar14 = (pEVar12->mPosition).y - pPosition->y;
        fVar15 = (pEVar12->mPosition).z - pPosition->z;
        fVar14 = fVar15 * fVar15 + fVar13 * fVar13 + fVar14 * fVar14;
        fVar13 = (float)(-0x80000000 - (int)fVar14);
        if (-1 < (int)fVar14) {
          fVar13 = fVar14;
        }
        if ((int)fVar13 < 7) {
          __position._M_current =
               (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,__position,
                       &pEVar12->mIndex);
          }
          else {
            *__position._M_current = pEVar12->mIndex;
            ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        pEVar12 = pEVar12 + 1;
        if (pEVar12 ==
            (this->mPositions).
            super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          return;
        }
      }
      return;
    }
    aVar2 = pEVar12[uVar5].mDistance;
    aVar10 = (ai_real)(-0x80000000 - (int)aVar2);
    if (-1 < (int)aVar2) {
      aVar10 = aVar2;
    }
    if ((int)aVar10 <= iVar7) {
      uVar6 = (ulong)uVar5;
      goto LAB_003bded8;
    }
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

void SpatialSort::FindIdenticalPositions( const aiVector3D& pPosition,
    std::vector<unsigned int>& poResults) const
{
    // Epsilons have a huge disadvantage: they are of constant precision, while floating-point
    //  values are of log2 precision. If you apply e=0.01 to 100, the epsilon is rather small, but
    //  if you apply it to 0.001, it is enormous.

    // The best way to overcome this is the unit in the last place (ULP). A precision of 2 ULPs
    //  tells us that a float does not differ more than 2 bits from the "real" value. ULPs are of
    //  logarithmic precision - around 1, they are 1*(2^24) and around 10000, they are 0.00125.

    // For standard C math, we can assume a precision of 0.5 ULPs according to IEEE 754. The
    //  incoming vertex positions might have already been transformed, probably using rather
    //  inaccurate SSE instructions, so we assume a tolerance of 4 ULPs to safely identify
    //  identical vertex positions.
    static const int toleranceInULPs = 4;
    // An interesting point is that the inaccuracy grows linear with the number of operations:
    //  multiplying to numbers, each inaccurate to four ULPs, results in an inaccuracy of four ULPs
    //  plus 0.5 ULPs for the multiplication.
    // To compute the distance to the plane, a dot product is needed - that is a multiplication and
    //  an addition on each number.
    static const int distanceToleranceInULPs = toleranceInULPs + 1;
    // The squared distance between two 3D vectors is computed the same way, but with an additional
    //  subtraction.
    static const int distance3DToleranceInULPs = distanceToleranceInULPs + 1;

    // Convert the plane distance to its signed integer representation so the ULPs tolerance can be
    //  applied. For some reason, VC won't optimize two calls of the bit pattern conversion.
    const BinFloat minDistBinary = ToBinary( pPosition * mPlaneNormal) - distanceToleranceInULPs;
    const BinFloat maxDistBinary = minDistBinary + 2 * distanceToleranceInULPs;

    // clear the array in this strange fashion because a simple clear() would also deallocate
    // the array which we want to avoid
    poResults.resize( 0 );

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        // Ugly, but conditional jumps are faster with integers than with floats
        if( minDistBinary > ToBinary(mPositions[index].mDistance))
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && minDistBinary < ToBinary(mPositions[index].mDistance) )
        index--;
    while( index < (mPositions.size() - 1) && minDistBinary > ToBinary(mPositions[index].mDistance))
        index++;

    // Now start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the tolerance to the result array
    std::vector<Entry>::const_iterator it = mPositions.begin() + index;
    while( ToBinary(it->mDistance) < maxDistBinary)
    {
        if( distance3DToleranceInULPs >= ToBinary((it->mPosition - pPosition).SquareLength()))
            poResults.push_back(it->mIndex);
        ++it;
        if( it == mPositions.end())
            break;
    }

    // that's it
}